

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

bitset_container_t * bitset_container_from_array(array_container_t *ac)

{
  bitset_container_t *bitset;
  ulong uVar1;
  ulong uVar2;
  
  bitset = bitset_container_create();
  uVar1 = 0;
  uVar2 = (ulong)(uint)ac->cardinality;
  if (ac->cardinality < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    bitset_container_set(bitset,ac->array[uVar1]);
  }
  return bitset;
}

Assistant:

bitset_container_t *bitset_container_from_array(const array_container_t *ac) {
    bitset_container_t *ans = bitset_container_create();
    int limit = array_container_cardinality(ac);
    for (int i = 0; i < limit; ++i) bitset_container_set(ans, ac->array[i]);
    return ans;
}